

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ab78d::AV1HighbdCompAvgPredTest::~AV1HighbdCompAvgPredTest
          (AV1HighbdCompAvgPredTest *this)

{
  code *pcVar1;
  AV1HighbdCompAvgPredTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

AV1HighbdCompAvgPredTest::~AV1HighbdCompAvgPredTest() {
  aom_free(comp_pred1_);
  aom_free(comp_pred2_);
  aom_free(pred_);
  aom_free(ref_);
}